

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCut.c
# Opt level: O2

void Abc_NtkCutsOracle(Abc_Ntk_t *pNtk,Cut_Oracle_t *p)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *vFanCounts;
  Abc_Obj_t *pAVar3;
  Vec_Ptr_t *p_00;
  void *pvVar4;
  int *piVar5;
  int iVar6;
  
  iVar2 = Cut_OracleReadDrop(p);
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcCut.c"
                  ,0xeb,"void Abc_NtkCutsOracle(Abc_Ntk_t *, Cut_Oracle_t *)");
  }
  if (iVar2 != 0) {
    vFanCounts = Abc_NtkFanoutCounts(pNtk);
    Cut_OracleSetFanoutCounts(p,vFanCounts);
  }
  for (iVar6 = 0; iVar6 < pNtk->vCis->nSize; iVar6 = iVar6 + 1) {
    pAVar3 = Abc_NtkCi(pNtk,iVar6);
    if (0 < (pAVar3->vFanouts).nSize) {
      Cut_OracleNodeSetTriv(p,pAVar3->Id);
    }
  }
  iVar6 = 0;
  p_00 = Abc_AigDfs(pNtk,0,1);
  do {
    if (p_00->nSize <= iVar6) {
      Vec_PtrFree(p_00);
      return;
    }
    pvVar4 = Vec_PtrEntry(p_00,iVar6);
    uVar1 = *(uint *)((long)pvVar4 + 0x14);
    if ((uVar1 & 0xf) - 5 < 0xfffffffe) {
      Cut_OracleComputeCuts
                (p,*(int *)((long)pvVar4 + 0x10),**(int **)((long)pvVar4 + 0x20),
                 (*(int **)((long)pvVar4 + 0x20))[1],uVar1 >> 10 & 1,uVar1 >> 0xb & 1);
      if (iVar2 != 0) {
        Cut_OracleTryDroppingCuts(p,**(int **)((long)pvVar4 + 0x20));
        piVar5 = (int *)(*(long *)((long)pvVar4 + 0x20) + 4);
LAB_0026dcd9:
        Cut_OracleTryDroppingCuts(p,*piVar5);
      }
    }
    else if (iVar2 != 0) {
      piVar5 = *(int **)((long)pvVar4 + 0x20);
      goto LAB_0026dcd9;
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

void Abc_NtkCutsOracle( Abc_Ntk_t * pNtk, Cut_Oracle_t * p )
{
    Abc_Obj_t * pObj;
    Vec_Ptr_t * vNodes;
    int i; //, clk = Abc_Clock();
    int fDrop = Cut_OracleReadDrop(p);

    assert( Abc_NtkIsStrash(pNtk) );

    // prepare cut droppping
    if ( fDrop )
        Cut_OracleSetFanoutCounts( p, Abc_NtkFanoutCounts(pNtk) );

    // set cuts for PIs
    Abc_NtkForEachCi( pNtk, pObj, i )
        if ( Abc_ObjFanoutNum(pObj) > 0 )
            Cut_OracleNodeSetTriv( p, pObj->Id );

    // compute cuts for internal nodes
    vNodes = Abc_AigDfs( pNtk, 0, 1 ); // collects POs
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        // when we reached a CO, it is time to deallocate the cuts
        if ( Abc_ObjIsCo(pObj) )
        {
            if ( fDrop )
                Cut_OracleTryDroppingCuts( p, Abc_ObjFaninId0(pObj) );
            continue;
        }
        // skip constant node, it has no cuts
//        if ( Abc_NodeIsConst(pObj) )
//            continue;
        // compute the cuts to the internal node
        Cut_OracleComputeCuts( p, pObj->Id, Abc_ObjFaninId0(pObj), Abc_ObjFaninId1(pObj),  
                Abc_ObjFaninC0(pObj), Abc_ObjFaninC1(pObj) );
        // consider dropping the fanins cuts
        if ( fDrop )
        {
            Cut_OracleTryDroppingCuts( p, Abc_ObjFaninId0(pObj) );
            Cut_OracleTryDroppingCuts( p, Abc_ObjFaninId1(pObj) );
        }
    }
    Vec_PtrFree( vNodes );
//ABC_PRT( "Total", Abc_Clock() - clk );
//Abc_NtkPrintCuts_( p, pNtk, 0 );
}